

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

Blob * __thiscall flexbuffers::Reference::AsBlob(Blob *__return_storage_ptr__,Reference *this)

{
  uint8_t *data_buf;
  Reference *this_local;
  
  if ((this->type_ == FBT_BLOB) || (this->type_ == FBT_STRING)) {
    data_buf = Indirect(this);
    Blob::Blob(__return_storage_ptr__,data_buf,this->byte_width_);
  }
  else {
    Blob::EmptyBlob();
  }
  return __return_storage_ptr__;
}

Assistant:

Blob AsBlob() const {
    if (type_ == FBT_BLOB || type_ == FBT_STRING) {
      return Blob(Indirect(), byte_width_);
    } else {
      return Blob::EmptyBlob();
    }
  }